

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.cpp
# Opt level: O0

void __thiscall
spvtools::opt::FixStorageClass::ChangeResultStorageClass
          (FixStorageClass *this,Instruction *inst,StorageClass storage_class)

{
  uint32_t uVar1;
  Op OVar2;
  IRContext *pIVar3;
  TypeManager *this_00;
  DefUseManager *this_01;
  Instruction *this_02;
  uint32_t new_result_type_id;
  uint32_t pointee_type_id;
  Instruction *result_type_inst;
  TypeManager *type_mgr;
  StorageClass storage_class_local;
  Instruction *inst_local;
  FixStorageClass *this_local;
  
  pIVar3 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_type_mgr(pIVar3);
  this_01 = Pass::get_def_use_mgr(&this->super_Pass);
  uVar1 = opt::Instruction::type_id(inst);
  this_02 = analysis::DefUseManager::GetDef(this_01,uVar1);
  OVar2 = opt::Instruction::opcode(this_02);
  if (OVar2 == OpTypePointer) {
    uVar1 = opt::Instruction::GetSingleWordInOperand(this_02,1);
    uVar1 = analysis::TypeManager::FindPointerToType(this_00,uVar1,storage_class);
    opt::Instruction::SetResultType(inst,uVar1);
    pIVar3 = Pass::context(&this->super_Pass);
    IRContext::UpdateDefUse(pIVar3,inst);
    return;
  }
  __assert_fail("result_type_inst->opcode() == spv::Op::OpTypePointer",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp"
                ,0x87,
                "void spvtools::opt::FixStorageClass::ChangeResultStorageClass(Instruction *, spv::StorageClass) const"
               );
}

Assistant:

void FixStorageClass::ChangeResultStorageClass(
    Instruction* inst, spv::StorageClass storage_class) const {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  Instruction* result_type_inst = get_def_use_mgr()->GetDef(inst->type_id());
  assert(result_type_inst->opcode() == spv::Op::OpTypePointer);
  uint32_t pointee_type_id = result_type_inst->GetSingleWordInOperand(1);
  uint32_t new_result_type_id =
      type_mgr->FindPointerToType(pointee_type_id, storage_class);
  inst->SetResultType(new_result_type_id);
  context()->UpdateDefUse(inst);
}